

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O0

int main(void)

{
  run_test();
  return 0;
}

Assistant:

int main(void) {
    run_test();
    return 0;
}